

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-loop-handles.c
# Opt level: O3

void idle_1_cb(uv_idle_t *handle)

{
  int iVar1;
  undefined8 uVar2;
  char *pcVar3;
  
  fputs("IDLE_1_CB\n",_stderr);
  fflush(_stderr);
  if (handle == (uv_idle_t *)0x0) {
    pcVar3 = "handle != NULL";
    uVar2 = 0x92;
  }
  else {
    if (0 < idles_1_active) {
      if (idle_2_is_active == '\0') {
        iVar1 = uv_is_closing(&idle_2_handle);
        if (iVar1 == 0) {
          uVar2 = uv_default_loop();
          iVar1 = uv_idle_init(uVar2,&idle_2_handle);
          if (iVar1 != 0) {
            pcVar3 = "r == 0";
            uVar2 = 0x98;
            goto LAB_0012c3a6;
          }
          iVar1 = uv_idle_start(&idle_2_handle,idle_2_cb);
          if (iVar1 != 0) {
            pcVar3 = "r == 0";
            uVar2 = 0x9a;
            goto LAB_0012c3a6;
          }
          idle_2_is_active = '\x01';
          idle_2_cb_started = idle_2_cb_started + 1;
        }
      }
      idle_1_cb_called = idle_1_cb_called + 1;
      if (idle_1_cb_called % 5 == 0) {
        iVar1 = uv_idle_stop(handle);
        if (iVar1 != 0) {
          pcVar3 = "r == 0";
          uVar2 = 0xa3;
          goto LAB_0012c3a6;
        }
        idles_1_active = idles_1_active + -1;
      }
      return;
    }
    pcVar3 = "idles_1_active > 0";
    uVar2 = 0x93;
  }
LAB_0012c3a6:
  fprintf(_stderr,"Assertion failed in %s on line %d: %s\n",
          "/workspace/llm4binary/github/license_all_cmakelists_25/revery-ui[P]esy-libuv/test/test-loop-handles.c"
          ,uVar2,pcVar3);
  abort();
}

Assistant:

static void idle_1_cb(uv_idle_t* handle) {
  int r;

  fprintf(stderr, "%s", "IDLE_1_CB\n");
  fflush(stderr);

  ASSERT(handle != NULL);
  ASSERT(idles_1_active > 0);

  /* Init idle_2 and make it active */
  if (!idle_2_is_active && !uv_is_closing((uv_handle_t*)&idle_2_handle)) {
    r = uv_idle_init(uv_default_loop(), &idle_2_handle);
    ASSERT(r == 0);
    r = uv_idle_start(&idle_2_handle, idle_2_cb);
    ASSERT(r == 0);
    idle_2_is_active = 1;
    idle_2_cb_started++;
  }

  idle_1_cb_called++;

  if (idle_1_cb_called % 5 == 0) {
    r = uv_idle_stop((uv_idle_t*)handle);
    ASSERT(r == 0);
    idles_1_active--;
  }
}